

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconhmp.cpp
# Opt level: O0

void __thiscall CVmFormatter::expand_pending_tab(CVmFormatter *this,int allow_anon)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int in_ESI;
  long in_RDI;
  int startcol;
  int col;
  int i;
  int spaces;
  int txtlen;
  int local_1c;
  int local_18;
  int local_14;
  
  switch(*(undefined4 *)(in_RDI + 0xf008)) {
  case 0:
    return;
  case 1:
    return;
  case 2:
    iVar1 = *(int *)(in_RDI + 0x1c) - *(int *)(in_RDI + 0xf01c);
    if (*(long *)(in_RDI + 0xf010) == 0) {
      if (in_ESI == 0) {
        local_14 = 0;
      }
      else {
        iVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
        local_14 = ((iVar2 - *(int *)(in_RDI + 0xf01c)) - iVar1) / 2;
      }
    }
    else {
      iVar1 = *(int *)(*(long *)(in_RDI + 0xf010) + 0x24) - iVar1 / 2;
      if (*(int *)(in_RDI + 0xf01c) < iVar1) {
        local_14 = iVar1 - *(int *)(in_RDI + 0xf01c);
      }
      else {
        local_14 = 0;
      }
    }
    break;
  case 3:
    if (*(long *)(in_RDI + 0xf010) == 0) {
      if (in_ESI == 0) {
        local_14 = 0;
      }
      else {
        iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x30))();
        local_14 = (iVar1 + -1) - *(int *)(in_RDI + 0x1c);
      }
    }
    else if (*(int *)(in_RDI + 0x1c) < *(int *)(*(long *)(in_RDI + 0xf010) + 0x24)) {
      local_14 = *(int *)(*(long *)(in_RDI + 0xf010) + 0x24) - *(int *)(in_RDI + 0x1c);
    }
    else {
      local_14 = 0;
    }
    break;
  case 4:
    local_1c = *(int *)(in_RDI + 0xf01c);
    local_18 = *(int *)(in_RDI + 0x18) - (*(int *)(in_RDI + 0x1c) - local_1c);
    while ((local_18 < *(int *)(in_RDI + 0x18) &&
           (*(int *)(in_RDI + 0x28 + (long)local_18 * 4) != *(int *)(in_RDI + 0xf018)))) {
      local_18 = local_18 + 1;
      local_1c = local_1c + 1;
    }
    if (local_1c < *(int *)(*(long *)(in_RDI + 0xf010) + 0x24)) {
      local_14 = *(int *)(*(long *)(in_RDI + 0xf010) + 0x24) - local_1c;
    }
    else {
      local_14 = 0;
    }
  }
  if (0 < local_14) {
    local_18 = *(int *)(in_RDI + 0x18) - (*(int *)(in_RDI + 0x1c) - *(int *)(in_RDI + 0xf01c));
    memmove((void *)(in_RDI + 0x28 + (long)local_18 * 4 + (long)local_14 * 4),
            (void *)(in_RDI + 0x28 + (long)local_18 * 4),
            (long)((*(int *)(in_RDI + 0x18) - local_18) + 1) << 2);
    memmove((void *)(in_RDI + 0x2030 + (long)local_18 * 0x18 + (long)local_14 * 0x18),
            (void *)(in_RDI + 0x2030 + (long)local_18 * 0x18),
            (long)((*(int *)(in_RDI + 0x18) - local_18) + 1) * 0x18);
    *(int *)(in_RDI + 0x1c) = local_14 + *(int *)(in_RDI + 0x1c);
    *(int *)(in_RDI + 0x18) = local_14 + *(int *)(in_RDI + 0x18);
    for (; local_14 != 0; local_14 = local_14 + -1) {
      *(undefined4 *)(in_RDI + 0x28 + (long)local_18 * 4) = 0x20;
      puVar3 = (undefined8 *)(in_RDI + 0x2030 + (long)local_18 * 0x18);
      *puVar3 = *(undefined8 *)(in_RDI + 0xf020);
      puVar3[1] = *(undefined8 *)(in_RDI + 0xf028);
      puVar3[2] = *(undefined8 *)(in_RDI + 0xf030);
      local_18 = local_18 + 1;
    }
  }
  *(undefined4 *)(in_RDI + 0xf008) = 0;
  return;
}

Assistant:

void CVmFormatter::expand_pending_tab(VMG_ int allow_anon)
{
    int txtlen;
    int spaces;
    int i;
    int col;
    
    /* check the alignment */
    switch(pending_tab_align_)
    {
    case VMFMT_TAB_LEFT:
        /* 
         *   left-aligned tabs are never pending, so this should never
         *   happen 
         */
        assert(FALSE);
        return;

    case VMFMT_TAB_NONE:
        /* there's no pending tab, so there's nothing to do */
        return;

    case VMFMT_TAB_RIGHT:
        /*
         *   It's a right-aligned tab.  If we have a TO, expand the tab with
         *   enough spaces to push the text up to the defined tab's column;
         *   otherwise, insert spaces to push the text to the full line
         *   width.  
         */
        if (pending_tab_entry_ != 0)
        {
            /* 
             *   if we're not past the tab, insert enough spaces to get us
             *   there; if we're already past the tab, insert nothing 
             */
            if (pending_tab_entry_->column_ > linecol_)
                spaces = pending_tab_entry_->column_ - linecol_;
            else
                spaces = 0;
        }
        else if (allow_anon)
        {
            /* push the text to the full line width */
            spaces = console_->get_line_width() - 1 - linecol_;
        }
        else
        {
            /* it's anonymous, but these aren't allowed - ignore it */
            spaces = 0;
        }
        break;

    case VMFMT_TAB_CENTER:
        /*
         *   It's a center-aligned tab.  If we have a TO, expand the tab
         *   with enough spaces to center the text on the defined tab's
         *   column; otherwise, center the text between the tab's starting
         *   column and the full line width. 
         */
        txtlen = linecol_ - pending_tab_start_;
        if (pending_tab_entry_ != 0)
        {
            int startcol;
            
            /* 
             *   find the column where the text would have to start for the
             *   text to be centered over the tab's column 
             */
            startcol = pending_tab_entry_->column_ - (txtlen / 2);

            /* 
             *   if that's past the starting column, insert enough spaces to
             *   get us there; otherwise, do nothing, as we'd have to start
             *   to the left of the leftmost place we can put the text 
             */
            if (startcol > pending_tab_start_)
                spaces = startcol - pending_tab_start_;
            else
                spaces = 0;
        }
        else if (allow_anon)
        {
            /* center the text in the remaining space to the line width */
            spaces = ((console_->get_line_width() - pending_tab_start_)
                      - txtlen) / 2;
        }
        else
        {
            /* it's anonymous, but these aren't allowed - ignore it */
            spaces = 0;
        }
        break;

    case VMFMT_TAB_DECIMAL:
        /*
         *   Decimal tab.  Scan the text after the tab, looking for the
         *   first occurrence of the decimal point character. 
         */
        for (col = pending_tab_start_, i = linepos_ - (linecol_ - col) ;
             i < linepos_ ; ++i, ++col)
        {
            /* if this is the decimal point character, stop looking */
            if (linebuf_[i] == pending_tab_dp_)
                break;
        }

        /* 
         *   insert enough spaces to put the decimal point character in the
         *   defined tab's column; if the decimal point character is already
         *   past the tab's column, do nothing 
         */
        if (pending_tab_entry_->column_ > col)
            spaces = pending_tab_entry_->column_ - col;
        else
            spaces = 0;
        break;
    }

    /* insert the spaces into the buffer where the <TAB> appeared */
    if (spaces > 0)
    {
        /* 
         *   Calculate the index in the buffer of the insertion point.  To
         *   do this, start with linepos_, which the current output index in
         *   the buffer, and subtract the difference between linecol_ and
         *   the tab starting column, since this will give us the number of
         *   characters in the buffer since the tab insertion point. 
         */
        i = linepos_ - (linecol_ - pending_tab_start_);

        /* 
         *   open up the line buffer and line color buffer by the number of
         *   spaces we're adding 
         */
        memmove(linebuf_ + i + spaces, linebuf_ + i,
                (linepos_ - i + 1)*sizeof(linebuf_[0]));
        memmove(colorbuf_ + i + spaces, colorbuf_ + i,
                (linepos_ - i + 1)*sizeof(colorbuf_[0]));

        /* advance the line and column positions for the insertion */
        linecol_ += spaces;
        linepos_ += spaces;

        /* insert the spaces */
        for ( ; spaces != 0 ; --spaces, ++i)
        {
            /* insert a space of the same color active at the <TAB> */
            linebuf_[i] = ' ';
            colorbuf_[i] = pending_tab_color_;
        }
    }

    /* we've handled the pending tab, so we can forget about it */
    pending_tab_align_ = VMFMT_TAB_NONE;
}